

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.h
# Opt level: O3

void __thiscall
ForStatement::GenerateStatementInline(ForStatement *this,ostream *out,int n,StatementPtr *statement)

{
  char cVar1;
  element_type *peVar2;
  long lVar3;
  ulong uVar4;
  string text;
  ostringstream statementBuffer;
  long *local_1c8;
  ulong local_1c0;
  long local_1b8 [2];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  peVar2 = (statement->super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (*peVar2->_vptr_Statement[1])(peVar2,local_1a8,0);
  std::__cxx11::stringbuf::str();
  while (uVar4 = 0, local_1c0 != 0) {
    cVar1 = *(char *)((long)local_1c8 + (local_1c0 - 1));
    if ((cVar1 != ';') && (cVar1 != '\n')) {
      goto LAB_0011fa42;
    }
    std::__cxx11::string::resize((ulong)&local_1c8,(char)local_1c0 + -1);
  }
  goto LAB_0011fa85;
  while (std::__cxx11::string::insert((ulong)&local_1c8,lVar3 + 1U,(char)n), uVar4 = local_1c0,
        lVar3 + 1U + (long)n < local_1c0) {
LAB_0011fa42:
    lVar3 = std::__cxx11::string::find((char)&local_1c8,10);
    uVar4 = local_1c0;
    if (lVar3 == -1) break;
  }
LAB_0011fa85:
  std::__ostream_insert<char,std::char_traits<char>>(out,(char *)local_1c8,uVar4);
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8,local_1b8[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void GenerateStatementInline( std::ostream& out, int n, StatementPtr statement ) const
	{
		std::ostringstream statementBuffer;
		statement->GenerateCode(statementBuffer, 0);

		std::string text = statementBuffer.str();

		while (!text.empty() && (text[text.length()-1] == '\n' || text[text.length()-1] == ';'))
			text.resize(text.length()-1); //remove last element

		AssureIndents(text, n);

		out << text;
	}